

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::anon_unknown_2::DepthRangeCase::test(DepthRangeCase *this)

{
  CallLogWrapper *this_00;
  GLfloat n;
  int iVar1;
  int ndx;
  long lVar2;
  float fVar3;
  float fVar4;
  Random rnd;
  deRandom local_38;
  
  deRandom_init(&local_38,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[4])
            (0,0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb70);
  lVar2 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  do {
    n = (GLfloat)(&DAT_01c0f2e0)[lVar2 * 2];
    glu::CallLogWrapper::glDepthRangef(this_00,n,(GLfloat)(&DAT_01c0f2e4)[lVar2 * 2]);
    (*this->m_verifier->_vptr_StateVerifier[4])
              (n,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb70);
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  iVar1 = 0x78;
  do {
    fVar3 = deRandom_getFloat(&local_38);
    fVar4 = deRandom_getFloat(&local_38);
    glu::CallLogWrapper::glDepthRangef(this_00,fVar3 + 0.0,fVar4 + 0.0);
    (*this->m_verifier->_vptr_StateVerifier[4])
              (fVar3 + 0.0,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb70);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat2Expanded(m_testCtx, GL_DEPTH_RANGE, 0.0f, 1.0f);
		expectError(GL_NO_ERROR);

		const struct FixedTest
		{
			float n, f;
		} fixedTests[] =
		{
			{ 0.5f, 1.0f },
			{ 0.0f, 0.5f },
			{ 0.0f, 0.0f },
			{ 1.0f, 1.0f }
		};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
		{
			glDepthRangef(fixedTests[ndx].n, fixedTests[ndx].f);

			m_verifier->verifyFloat2Expanded(m_testCtx, GL_DEPTH_RANGE, fixedTests[ndx].n, fixedTests[ndx].f);
			expectError(GL_NO_ERROR);
		}

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLfloat n	= rnd.getFloat(0, 1);
			GLfloat f	= rnd.getFloat(0, 1);

			glDepthRangef(n, f);
			m_verifier->verifyFloat2Expanded(m_testCtx, GL_DEPTH_RANGE, n, f);
			expectError(GL_NO_ERROR);
		}
	}